

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

FilterPropagateResult
duckdb::CheckParquetStringFilter(BaseStatistics *stats,Statistics *pq_col_stats,TableFilter *filter)

{
  ExpressionType comparison_type;
  pointer puVar1;
  const_data_ptr_t min_data;
  idx_t min_len;
  const_data_ptr_t max_data;
  idx_t max_len;
  FilterPropagateResult FVar2;
  FilterPropagateResult FVar3;
  int iVar4;
  ConjunctionAndFilter *pCVar5;
  type filter_00;
  ConstantFilter *pCVar6;
  string *constant;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer this;
  
  if (filter->filter_type == CONSTANT_COMPARISON) {
    pCVar6 = TableFilter::Cast<duckdb::ConstantFilter>(filter);
    min_data = (const_data_ptr_t)(pq_col_stats->min_value)._M_dataplus._M_p;
    min_len = (pq_col_stats->min_value)._M_string_length;
    max_data = (const_data_ptr_t)(pq_col_stats->max_value)._M_dataplus._M_p;
    max_len = (pq_col_stats->max_value)._M_string_length;
    comparison_type = (pCVar6->super_TableFilter).field_0x9;
    constant = StringValue::Get_abi_cxx11_(&pCVar6->constant);
    FVar3 = StringStats::CheckZonemap(min_data,min_len,max_data,max_len,comparison_type,constant);
    return FVar3;
  }
  if (filter->filter_type == CONJUNCTION_AND) {
    pCVar5 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    this = (pCVar5->super_ConjunctionFilter).child_filters.
           super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pCVar5->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    FVar3 = FILTER_ALWAYS_TRUE;
    while( true ) {
      if (this == puVar1) {
        return FVar3;
      }
      filter_00 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(this);
      FVar2 = CheckParquetStringFilter(stats,pq_col_stats,filter_00);
      if (FVar2 == FILTER_ALWAYS_FALSE) break;
      if (FVar2 != FVar3) {
        FVar3 = NO_PRUNING_POSSIBLE;
      }
      this = this + 1;
    }
    return FILTER_ALWAYS_FALSE;
  }
  iVar4 = (*filter->_vptr_TableFilter[2])(filter,stats);
  return (FilterPropagateResult)iVar4;
}

Assistant:

static FilterPropagateResult CheckParquetStringFilter(BaseStatistics &stats, const Statistics &pq_col_stats,
                                                      TableFilter &filter) {
	switch (filter.filter_type) {
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_filter = filter.Cast<ConjunctionAndFilter>();
		auto and_result = FilterPropagateResult::FILTER_ALWAYS_TRUE;
		for (auto &child_filter : conjunction_filter.child_filters) {
			auto child_prune_result = CheckParquetStringFilter(stats, pq_col_stats, *child_filter);
			if (child_prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
				return FilterPropagateResult::FILTER_ALWAYS_FALSE;
			}
			if (child_prune_result != and_result) {
				and_result = FilterPropagateResult::NO_PRUNING_POSSIBLE;
			}
		}
		return and_result;
	}
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = filter.Cast<ConstantFilter>();
		auto &min_value = pq_col_stats.min_value;
		auto &max_value = pq_col_stats.max_value;
		return StringStats::CheckZonemap(const_data_ptr_cast(min_value.c_str()), min_value.size(),
		                                 const_data_ptr_cast(max_value.c_str()), max_value.size(),
		                                 constant_filter.comparison_type, StringValue::Get(constant_filter.constant));
	}
	default:
		return filter.CheckStatistics(stats);
	}
}